

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

Abc_Ntk_t *
Abc_NtkFindExact(word *pTruth,int nVars,int nFunc,int nMaxDepth,int *pArrTimeProfile,int nBTLimit,
                int nStartGates,int fVerbose)

{
  char cVar1;
  byte bVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  Ses_Man_t *pSes;
  char *__ptr;
  Abc_Ntk_t *pNtk;
  char *pcVar7;
  uint *__ptr_00;
  void *pvVar8;
  Vec_Ptr_t *vNames;
  void **ppvVar9;
  Abc_Obj_t *pAVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  Abc_Obj_t *pFanin;
  long lVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  char *local_90;
  ulong local_88;
  timespec ts;
  long local_60;
  
  if (6 < nVars - 2U) {
    __assert_fail("nVars >= 2 && nVars <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0x976,"Abc_Ntk_t *Abc_NtkFindExact(word *, int, int, int, int *, int, int, int)")
    ;
  }
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    local_60 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_60 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) +
               CONCAT35(ts.tv_sec._5_3_,
                        CONCAT23(ts.tv_sec._3_2_,
                                 CONCAT12(ts.tv_sec._2_1_,CONCAT11(ts.tv_sec._1_1_,(byte)ts.tv_sec))
                                )) * -1000000;
  }
  pSes = Ses_ManAlloc(pTruth,nVars,nFunc,nMaxDepth,pArrTimeProfile,0,nBTLimit,fVerbose);
  pSes->nStartGates = nStartGates;
  pSes->fSatVerbose = 0;
  pSes->fReasonVerbose = 0;
  if (fVerbose != 0) {
    Ses_ManPrintFuncs(pSes);
  }
  __ptr = Ses_ManFindMinimumSize(pSes);
  if (__ptr == (char *)0x0) {
    pNtk = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
    pcVar7 = Extra_UtilStrsav("exact");
    pNtk->pName = pcVar7;
    iVar5 = (int)*__ptr;
    cVar1 = __ptr[2];
    __ptr_00 = (uint *)malloc(0x10);
    local_88 = 8;
    if (6 < (cVar1 + iVar5) - 1U) {
      local_88 = (ulong)(uint)(cVar1 + iVar5);
    }
    __ptr_00[1] = 0;
    uVar6 = (uint)local_88;
    *__ptr_00 = uVar6;
    if (uVar6 == 0) {
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = malloc((long)(int)uVar6 << 3);
    }
    *(void **)(__ptr_00 + 2) = pvVar8;
    ts.tv_sec._3_2_ = 0x30;
    vNames = Abc_NodeGetFakeNames(__ptr[1] + iVar5);
    pVVar3 = pNtk->vObjs;
    uVar6 = pVVar3->nSize;
    if (uVar6 == pVVar3->nCap) {
      if ((int)uVar6 < 0x10) {
        if (pVVar3->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc(0x80);
        }
        else {
          ppvVar9 = (void **)realloc(pVVar3->pArray,0x80);
        }
        pVVar3->pArray = ppvVar9;
        pVVar3->nCap = 0x10;
      }
      else {
        if (pVVar3->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc((ulong)uVar6 << 4);
        }
        else {
          ppvVar9 = (void **)realloc(pVVar3->pArray,(ulong)uVar6 << 4);
        }
        pVVar3->pArray = ppvVar9;
        pVVar3->nCap = uVar6 * 2;
      }
    }
    else {
      ppvVar9 = pVVar3->pArray;
    }
    iVar5 = pVVar3->nSize;
    pVVar3->nSize = iVar5 + 1;
    ppvVar9[iVar5] = (void *)0x0;
    if (*__ptr < '\x01') {
      uVar17 = 0;
    }
    else {
      uVar18 = 0;
      do {
        pAVar10 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
        if ((long)vNames->nSize <= (long)uVar18) goto LAB_002bcd20;
        Abc_ObjAssignName(pAVar10,(char *)vNames->pArray[uVar18],(char *)0x0);
        if (uVar18 == local_88) {
          if ((int)local_88 < 0x10) {
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr_00 + 2),0x80);
            }
            *(void **)(__ptr_00 + 2) = pvVar8;
            *__ptr_00 = 0x10;
            local_88 = 0x10;
          }
          else {
            uVar6 = (int)local_88 * 2;
            local_88 = (ulong)uVar6;
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar8 = malloc(local_88 * 8);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr_00 + 2),local_88 * 8);
            }
            *(void **)(__ptr_00 + 2) = pvVar8;
            *__ptr_00 = uVar6;
          }
        }
        else {
          pvVar8 = *(void **)(__ptr_00 + 2);
        }
        uVar17 = uVar18 + 1;
        __ptr_00[1] = (uint)uVar17;
        *(Abc_Obj_t **)((long)pvVar8 + uVar18 * 8) = pAVar10;
        uVar18 = uVar17;
      } while ((long)uVar17 < (long)*__ptr);
    }
    iVar5 = (int)uVar17;
    local_90 = __ptr + 3;
    if ('\0' < __ptr[2]) {
      lVar14 = 0;
      lVar16 = 0;
      do {
        bVar2 = local_90[lVar16 * 4];
        ts.tv_sec._2_1_ = bVar2 & 1 | 0x30;
        ts.tv_sec._1_1_ = bVar2 >> 1 & 1 | 0x30;
        ts.tv_sec._0_1_ = bVar2 >> 2 & 1 | 0x30;
        if (__ptr[lVar16 * 4 + 4] != '\x02') {
          __assert_fail("*p == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                        ,0x700,"Abc_Ntk_t *Ses_ManExtractNtk(const char *)");
        }
        uVar18 = (uVar17 & 0xffffffff) + lVar16;
        pcVar7 = Abc_SopFromTruthBin((char *)&ts);
        pAVar10 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
        pcVar11 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,pcVar7);
        (pAVar10->field_5).pData = pcVar11;
        if (uVar18 == local_88) {
          if ((int)local_88 < 0x10) {
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr_00 + 2),0x80);
            }
            *(void **)(__ptr_00 + 2) = pvVar8;
            *__ptr_00 = 0x10;
            local_88 = 0x10;
          }
          else {
            uVar6 = (int)local_88 * 2;
            local_88 = (ulong)uVar6;
            if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
              pvVar8 = malloc(local_88 * 8);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr_00 + 2),local_88 * 8);
            }
            *(void **)(__ptr_00 + 2) = pvVar8;
            *__ptr_00 = uVar6;
          }
        }
        else {
          pvVar8 = *(void **)(__ptr_00 + 2);
        }
        __ptr_00[1] = iVar5 + (int)lVar16 + 1;
        *(Abc_Obj_t **)((long)pvVar8 + lVar16 * 8 + (uVar17 & 0xffffffff) * 8) = pAVar10;
        if (pcVar7 != (char *)0x0) {
          free(pcVar7);
        }
        lVar12 = (long)__ptr[lVar16 * 4 + 5];
        if ((lVar12 < 0) || ((long)uVar18 < lVar12)) goto LAB_002bcd20;
        lVar4 = *(long *)(__ptr_00 + 2);
        Abc_ObjAddFanin(pAVar10,*(Abc_Obj_t **)(lVar4 + lVar12 * 8));
        if ((__ptr[lVar16 * 4 + 6] < '\0') ||
           (uVar13 = (ulong)(uint)(int)__ptr[lVar16 * 4 + 6], uVar18 < uVar13)) goto LAB_002bcd20;
        Abc_ObjAddFanin(pAVar10,*(Abc_Obj_t **)(lVar4 + uVar13 * 8));
        lVar16 = lVar16 + 1;
        lVar14 = lVar14 + -4;
      } while ((int)lVar16 < (int)__ptr[2]);
      iVar5 = iVar5 + (int)lVar16;
      local_90 = local_90 + -lVar14;
    }
    if ('\0' < __ptr[1]) {
      iVar15 = 0;
      do {
        pAVar10 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
        uVar6 = *__ptr + iVar15;
        if (((int)uVar6 < 0) || (vNames->nSize <= (int)uVar6)) {
LAB_002bcd20:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        Abc_ObjAssignName(pAVar10,(char *)vNames->pArray[uVar6],(char *)0x0);
        cVar1 = *local_90;
        if (cVar1 < '\0') {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        uVar6 = ((uint)(int)cVar1 >> 1) + (int)*__ptr;
        if (((int)cVar1 & 1U) == 0) {
          if (((int)uVar6 < 0) || (iVar5 <= (int)uVar6)) goto LAB_002bcd20;
          pFanin = *(Abc_Obj_t **)(*(long *)(__ptr_00 + 2) + (ulong)uVar6 * 8);
        }
        else {
          if (((int)uVar6 < 0) || (iVar5 <= (int)uVar6)) goto LAB_002bcd20;
          pFanin = Abc_NtkCreateNodeInv
                             (pNtk,*(Abc_Obj_t **)(*(long *)(__ptr_00 + 2) + (ulong)uVar6 * 8));
        }
        Abc_ObjAddFanin(pAVar10,pFanin);
        local_90 = local_90 + (long)*__ptr + 2;
        iVar15 = iVar15 + 1;
      } while (iVar15 < __ptr[1]);
    }
    Abc_NodeFreeNames(vNames);
    if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
      free(*(void **)(__ptr_00 + 2));
    }
    free(__ptr_00);
    iVar5 = Abc_NtkCheck(pNtk);
    if (iVar5 == 0) {
      puts("Ses_ManExtractSolution(): Network check has failed.");
    }
    free(__ptr);
  }
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = ts.tv_nsec / 1000 +
             CONCAT35(ts.tv_sec._5_3_,
                      CONCAT23(ts.tv_sec._3_2_,
                               CONCAT12(ts.tv_sec._2_1_,CONCAT11(ts.tv_sec._1_1_,(byte)ts.tv_sec))))
             * 1000000;
  }
  pSes->timeTotal = lVar14 + local_60;
  if (fVerbose != 0) {
    Ses_ManPrintRuntime(pSes);
  }
  if (pSes->pSat != (sat_solver *)0x0) {
    sat_solver_delete(pSes->pSat);
  }
  Ses_ManCleanLight(pSes);
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkFindExact( word * pTruth, int nVars, int nFunc, int nMaxDepth, int * pArrTimeProfile, int nBTLimit, int nStartGates, int fVerbose )
{
    Ses_Man_t * pSes;
    char * pSol;
    Abc_Ntk_t * pNtk = NULL;
    abctime timeStart;

    /* some checks */
    assert( nVars >= 2 && nVars <= 8 );

    timeStart = Abc_Clock();

    pSes = Ses_ManAlloc( pTruth, nVars, nFunc, nMaxDepth, pArrTimeProfile, 0, nBTLimit, fVerbose );
    pSes->nStartGates = nStartGates;
    pSes->fReasonVerbose = 0;
    pSes->fSatVerbose = 0;
    if ( fVerbose )
        Ses_ManPrintFuncs( pSes );

    if ( ( pSol = Ses_ManFindMinimumSize( pSes ) ) != NULL )
    {
        pNtk = Ses_ManExtractNtk( pSol );
        ABC_FREE( pSol );
    }

    pSes->timeTotal = Abc_Clock() - timeStart;

    if ( fVerbose )
        Ses_ManPrintRuntime( pSes );

    /* cleanup */
    Ses_ManClean( pSes );

    return pNtk;
}